

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_Emit_Test::PrinterTest_Emit_Test
          (PrinterTest_Emit_Test *this)

{
  PrinterTest_Emit_Test *this_local;
  
  PrinterTest::PrinterTest(&this->super_PrinterTest);
  (this->super_PrinterTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PrinterTest_Emit_Test_02a1b9f8;
  return;
}

Assistant:

TEST_F(PrinterTest, Emit) {
  {
    Printer printer(output());
    printer.Emit(R"cc(
      class Foo {
        int x, y, z;
      };
    )cc");
    printer.Emit(R"java(
      public final class Bar {
        Bar() {}
      }
    )java");
  }

  EXPECT_EQ(written(),
            "class Foo {\n"
            "  int x, y, z;\n"
            "};\n"
            "public final class Bar {\n"
            "  Bar() {}\n"
            "}\n");
}